

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O1

bool __thiscall flow::lang::Parser::importDecl(Parser *this,UnitSym *unit)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Lexer *pLVar2;
  Report *this_00;
  long lVar3;
  size_type sVar4;
  bool bVar5;
  vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> *__range3;
  bool bVar6;
  _List_node_base *p_Var7;
  uint uVar8;
  _Alloc_hider _Var9;
  string base;
  string path;
  size_type __dnew;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Any_data *local_58;
  UnitSym *local_50;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_50 = unit;
  Lexer::nextToken((this->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node._M_size = 0;
  local_48._M_impl._M_node.super__List_node_base._M_prev =
       local_48._M_impl._M_node.super__List_node_base._M_next;
  bVar5 = importOne(this,(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_48._M_impl._M_node.super__List_node_base._M_next);
  if (bVar5) {
    do {
      pLVar2 = (this->lexer_)._M_t.
               super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
               _M_t.
               super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
               super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
      if (pLVar2->token_ != Comma) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        local_98._M_string_length = 0;
        local_98.field_2._M_local_buf[0] = '\0';
        if (pLVar2->token_ == From) {
          Lexer::nextToken(pLVar2);
          pLVar2 = (this->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
          paVar1 = &local_b8.field_2;
          _Var9._M_p = (pLVar2->stringValue_)._M_dataplus._M_p;
          local_b8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,_Var9._M_p,
                     _Var9._M_p + (pLVar2->stringValue_)._M_string_length);
          std::__cxx11::string::operator=((string *)&local_98,(string *)&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,
                            (ulong)(local_b8.field_2._M_allocated_capacity + 1));
          }
          pLVar2 = (this->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
          uVar8 = pLVar2->token_ - String;
          if (uVar8 < 2) {
            Lexer::nextToken(pLVar2);
          }
          else {
            this_00 = this->report_;
            local_78._M_dataplus._M_p = (char *)0x13;
            local_b8._M_dataplus._M_p = (pointer)paVar1;
            local_b8._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_78);
            local_b8.field_2._M_allocated_capacity = (size_type)local_78._M_dataplus._M_p;
            *(undefined8 *)local_b8._M_dataplus._M_p = 0x7463657078656e55;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p + 8) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p + 9) = 'd';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p + 10) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p + 0xb) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p + 0xc) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p + 0xd) = 'k';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p + 0xe) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p + 0xf) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p + 0xf) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p + 0x10) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p + 0x11) = '{';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p + 0x12) = '}';
            local_b8._M_string_length = (size_type)local_78._M_dataplus._M_p;
            local_b8._M_dataplus._M_p[(long)local_78._M_dataplus._M_p] = '\0';
            diagnostics::Report::syntaxError<flow::lang::Token>
                      (this_00,&pLVar2->lastLocation_,&local_b8,
                       ((this->lexer_)._M_t.
                        super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                        .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->token_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar1) {
              operator_delete(local_b8._M_dataplus._M_p,
                              (ulong)(local_b8.field_2._M_allocated_capacity + 1));
            }
          }
          if (1 < uVar8) {
            consumeUntil(this,Semicolon);
            goto LAB_00122a00;
          }
          if ((local_98._M_string_length != 0) && (*local_98._M_dataplus._M_p != '/')) {
            pLVar2 = (this->lexer_)._M_t.
                     super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                     .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
            lVar3 = *(long *)&(pLVar2->location_).filename._M_dataplus;
            local_b8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,lVar3,
                       *(size_type *)((long)&(pLVar2->location_).filename + 8) + lVar3);
            std::__cxx11::string::rfind((char)&local_b8,0x2f);
            std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_b8);
            std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            std::operator+(&local_78,&local_b8,&local_98);
            std::__cxx11::string::operator=((string *)&local_98,(string *)&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar1) {
              operator_delete(local_b8._M_dataplus._M_p,
                              (ulong)(local_b8.field_2._M_allocated_capacity + 1));
            }
          }
        }
        if (local_48._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_48)
        goto LAB_001229bc;
        local_58 = (_Any_data *)&this->importHandler_;
        p_Var7 = local_48._M_impl._M_node.super__List_node_base._M_next;
        goto LAB_0012292a;
      }
      Lexer::nextToken(pLVar2);
      bVar5 = importOne(this,(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_48);
    } while (bVar5);
  }
  consumeUntil(this,Semicolon);
  bVar6 = false;
  goto LAB_001226f5;
LAB_0012292a:
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity = 0;
  if (((this->importHandler_).super__Function_base._M_manager == (_Manager_type)0x0) ||
     (local_78._M_dataplus._M_p = (pointer)&local_b8,
     bVar5 = (*(this->importHandler_)._M_invoker)
                       (local_58,(string *)(p_Var7 + 1),&local_98,
                        (vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_> **)
                        &local_78), bVar5)) goto LAB_00122964;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_b8._M_dataplus._M_p,
                    local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
  }
LAB_00122a00:
  bVar6 = false;
  goto LAB_00122a02;
LAB_00122964:
  UnitSym::import(local_50,(string *)(p_Var7 + 1),&local_98);
  sVar4 = local_b8._M_string_length;
  for (_Var9._M_p = local_b8._M_dataplus._M_p; _Var9._M_p != (pointer)sVar4;
      _Var9._M_p = _Var9._M_p + 8) {
    declareBuiltin(this,*(NativeCallback **)_Var9._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_b8._M_dataplus._M_p,
                    local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
  }
  p_Var7 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  if (p_Var7 == (_List_node_base *)&local_48) goto LAB_001229bc;
  goto LAB_0012292a;
LAB_001229bc:
  bVar5 = expect(this,Semicolon);
  bVar6 = true;
  if (bVar5) {
    Lexer::nextToken((this->lexer_)._M_t.
                     super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                     .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
  }
LAB_00122a02:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
LAB_001226f5:
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_48);
  return bVar6;
}

Assistant:

bool Parser::importDecl(UnitSym* unit) {
  // 'import' NAME_OR_NAMELIST ['from' PATH] ';'
  nextToken();  // skip 'import'

  std::list<std::string> names;
  if (!importOne(names)) {
    consumeUntil(Token::Semicolon);
    return false;
  }

  while (token() == Token::Comma) {
    nextToken();
    if (!importOne(names)) {
      consumeUntil(Token::Semicolon);
      return false;
    }
  }

  std::string path;
  if (consumeIf(Token::From)) {
    path = stringValue();

    if (!consumeOne(Token::String, Token::RawString)) {
      consumeUntil(Token::Semicolon);
      return false;
    }

    if (!path.empty() && path[0] != '/') {
      std::string base(lexer_->location().filename);

      size_t r = base.rfind('/');
      if (r != std::string::npos) ++r;

      base = base.substr(0, r);
      path = base + path;
    }
  }

  for (const std::string& name: names) {
    std::vector<NativeCallback*> builtins;

    if (importHandler_ && !importHandler_(name, path, &builtins))
      return false;

    unit->import(name, path);

    for (NativeCallback* native : builtins) {
      declareBuiltin(native);
    }
  }

  consume(Token::Semicolon);
  return true;
}